

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenerateTableCreator
          (KotlinGenerator *this,StructDef *struct_def,CodeWriter *writer,IDLOptions *options)

{
  bool bVar1;
  bool bVar2;
  reference ppFVar3;
  ostream *poVar4;
  undefined8 extraout_RDX;
  anon_class_32_4_164dc76f local_350;
  function<void_()> local_330;
  allocator<char> local_309;
  string local_308;
  string local_2e8;
  string local_2c8;
  char *local_2a8;
  char *optional;
  FieldDef *local_280;
  FieldDef *field_1;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_270;
  iterator it_1;
  stringstream params;
  ostream local_258 [383];
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_a1;
  string local_a0;
  undefined1 local_80 [8];
  string name;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_50;
  iterator it;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> fields_vec;
  int num_fields;
  bool has_no_struct_fields;
  IDLOptions *options_local;
  CodeWriter *writer_local;
  StructDef *struct_def_local;
  KotlinGenerator *this_local;
  
  bVar2 = true;
  fields_vec.super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&it,
             &(struct_def->fields).vec);
  local_50._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&it);
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                       &it);
    bVar1 = __gnu_cxx::operator!=
                      (&local_50,
                       (__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_50);
    name.field_2._8_8_ = *ppFVar3;
    if ((((FieldDef *)name.field_2._8_8_)->deprecated & 1U) == 0) {
      bVar1 = IsStruct(&(((FieldDef *)name.field_2._8_8_)->value).type);
      if (bVar1) {
        bVar2 = false;
      }
      else {
        fields_vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             (int)fields_vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
      }
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_50);
  }
  if (((bVar2) &&
      ((int)fields_vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage != 0)) &&
     ((int)fields_vec.
           super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage < 0x7f)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"create",&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"",&local_d9);
    IdlNamer::LegacyJavaMethod2((string *)local_80,&this->namer_,&local_a0,struct_def,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    std::__cxx11::stringstream::stringstream((stringstream *)&it_1);
    std::operator<<(local_258,"builder: FlatBufferBuilder");
    local_270._M_current =
         (FieldDef **)
         std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                   ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&it
                   );
    while( true ) {
      field_1 = (FieldDef *)
                std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                          ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                            *)&it);
      bVar2 = __gnu_cxx::operator!=
                        (&local_270,
                         (__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                          *)&field_1);
      if (!bVar2) break;
      ppFVar3 = __gnu_cxx::
                __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                ::operator*(&local_270);
      local_280 = *ppFVar3;
      if ((local_280->deprecated & 1U) == 0) {
        poVar4 = std::operator<<(local_258,", ");
        IdlNamer::Variable_abi_cxx11_((string *)&optional,&this->namer_,local_280);
        std::operator<<(poVar4,(string *)&optional);
        std::__cxx11::string::~string((string *)&optional);
        bVar2 = IsScalar((local_280->value).type.base_type);
        if (bVar2) {
          std::operator<<(local_258,": ");
        }
        else {
          std::operator<<(local_258,"Offset: ");
        }
        bVar2 = FieldDef::IsScalarOptional(local_280);
        local_2a8 = "";
        if (bVar2) {
          local_2a8 = "?";
        }
        GenTypeBasic_abi_cxx11_
                  (&local_2c8,(KotlinGenerator *)&local_280->value,
                   (BaseType *)CONCAT71((int7)((ulong)extraout_RDX >> 8),bVar2));
        poVar4 = std::operator<<(local_258,(string *)&local_2c8);
        std::operator<<(poVar4,local_2a8);
        std::__cxx11::string::~string((string *)&local_2c8);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
      ::operator++(&local_270);
    }
    std::__cxx11::stringstream::str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"Int",&local_309);
    local_350.fields_vec =
         (vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&it;
    local_350.writer = writer;
    local_350.struct_def = struct_def;
    local_350.this = this;
    std::function<void()>::
    function<flatbuffers::kotlin::KotlinGenerator::GenerateTableCreator(flatbuffers::StructDef&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_1_,void>
              ((function<void()> *)&local_330,&local_350);
    GenerateFun(writer,(string *)local_80,&local_2e8,&local_308,&local_330,
                (bool)(options->gen_jvmstatic & 1));
    std::function<void_()>::~function(&local_330);
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator(&local_309);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&it_1);
    std::__cxx11::string::~string((string *)local_80);
  }
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::~vector
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&it);
  return;
}

Assistant:

void GenerateTableCreator(StructDef &struct_def, CodeWriter &writer,
                            const IDLOptions options) const {
    // Generate a method that creates a table in one go. This is only possible
    // when the table has no struct fields, since those have to be created
    // inline, and there's no way to do so in Java.
    bool has_no_struct_fields = true;
    int num_fields = 0;
    auto fields_vec = struct_def.fields.vec;

    for (auto it = fields_vec.begin(); it != fields_vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      if (IsStruct(field.value.type)) {
        has_no_struct_fields = false;
      } else {
        num_fields++;
      }
    }
    // JVM specifications restrict default constructor params to be < 255.
    // Longs and doubles take up 2 units, so we set the limit to be < 127.
    if (has_no_struct_fields && num_fields && num_fields < 127) {
      // Generate a table constructor of the form:
      // public static int createName(FlatBufferBuilder builder, args...)

      auto name = namer_.LegacyJavaMethod2("create", struct_def, "");
      std::stringstream params;
      params << "builder: FlatBufferBuilder";
      for (auto it = fields_vec.begin(); it != fields_vec.end(); ++it) {
        auto &field = **it;
        if (field.deprecated) continue;
        params << ", " << namer_.Variable(field);
        if (!IsScalar(field.value.type.base_type)) {
          params << "Offset: ";
        } else {
          params << ": ";
        }
        auto optional = field.IsScalarOptional() ? "?" : "";
        params << GenTypeBasic(field.value.type.base_type) << optional;
      }

      GenerateFun(
          writer, name, params.str(), "Int",
          [&]() {
            writer.SetValue("vec_size", NumToString(fields_vec.size()));

            writer += "builder.startTable({{vec_size}})";

            auto sortbysize = struct_def.sortbysize;
            auto largest = sortbysize ? sizeof(largest_scalar_t) : 1;
            for (size_t size = largest; size; size /= 2) {
              for (auto it = fields_vec.rbegin(); it != fields_vec.rend();
                   ++it) {
                auto &field = **it;
                auto base_type_size = SizeOf(field.value.type.base_type);
                if (!field.deprecated &&
                    (!sortbysize || size == base_type_size)) {
                  writer.SetValue("field_name", namer_.Field(field));

                  // we wrap on null check for scalar optionals
                  writer += field.IsScalarOptional()
                                ? "{{field_name}}?.run { \\"
                                : "\\";

                  writer += namer_.LegacyKotlinMethod("add", field, "") +
                            "(builder, {{field_name}}\\";
                  if (!IsScalar(field.value.type.base_type)) {
                    writer += "Offset\\";
                  }
                  // we wrap on null check for scalar optionals
                  writer += field.IsScalarOptional() ? ") }" : ")";
                }
              }
            }
            writer += "return end{{struct_name}}(builder)";
          },
          options.gen_jvmstatic);
    }
  }